

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int32_t pkg_archiveLibrary(char *targetDir,char *version,UBool reverseExt)

{
  char *pcVar1;
  int iVar2;
  int32_t iVar3;
  char *pcVar7;
  char *local_848;
  char local_828 [8];
  char cmd [2048];
  int32_t result;
  UBool reverseExt_local;
  char *version_local;
  char *targetDir_local;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  
  cmd[0x7f8] = '\0';
  cmd[0x7f9] = '\0';
  cmd[0x7fa] = '\0';
  cmd[0x7fb] = '\0';
  cmd[0x7ff] = reverseExt;
  iVar2 = strcmp(pkgDataFlags[2],pkgDataFlags[1]);
  if ((iVar2 == 0) || (iVar2 = strcmp(pkgDataFlags[3],pkgDataFlags[1]), iVar2 != 0)) {
    strcpy(libFileNames[2],libFileNames[3]);
  }
  else {
    pcVar7 = "";
    if (*pkgDataFlags[5] == '.') {
      pcVar7 = ".";
    }
    if (cmd[0x7ff] == '\0') {
      pcVar1 = pkgDataFlags[1];
      local_848 = version;
    }
    else {
      local_848 = pkgDataFlags[1];
      pcVar1 = version;
    }
    sprintf(libFileNames[2],"%s%s%s.%s",libFileNames,pcVar7,pcVar1,local_848);
    sprintf(local_828,"%s %s %s%s %s%s",pkgDataFlags[0xd],pkgDataFlags[0xe],targetDir,0x5120a0,
            targetDir,0x5121a0);
    cmd._2040_4_ = runCommand(local_828,'\0');
    if (cmd._2040_4_ != 0) {
      fprintf(_stderr,"Error creating archive library. Failed command: %s\n",local_828);
      iVar6._0_1_ = cmd[0x7f8];
      iVar6._1_1_ = cmd[0x7f9];
      iVar6._2_1_ = cmd[0x7fa];
      iVar6._3_1_ = cmd[0x7fb];
      return iVar6;
    }
    sprintf(local_828,"%s %s%s",pkgDataFlags[0xf],targetDir,0x5120a0);
    cmd._2040_4_ = runCommand(local_828,'\0');
    if (cmd._2040_4_ != 0) {
      fprintf(_stderr,"Error creating archive library. Failed command: %s\n",local_828);
      iVar5._0_1_ = cmd[0x7f8];
      iVar5._1_1_ = cmd[0x7f9];
      iVar5._2_1_ = cmd[0x7fa];
      iVar5._3_1_ = cmd[0x7fb];
      return iVar5;
    }
    sprintf(local_828,"%s %s%s","rm -f",targetDir,0x5121a0);
    cmd._2040_4_ = runCommand(local_828,'\0');
    if (cmd._2040_4_ != 0) {
      fprintf(_stderr,"Error creating archive library. Failed command: %s\n",local_828);
      iVar4._0_1_ = cmd[0x7f8];
      iVar4._1_1_ = cmd[0x7f9];
      iVar4._2_1_ = cmd[0x7fa];
      iVar4._3_1_ = cmd[0x7fb];
      return iVar4;
    }
  }
  iVar3._0_1_ = cmd[0x7f8];
  iVar3._1_1_ = cmd[0x7f9];
  iVar3._2_1_ = cmd[0x7fa];
  iVar3._3_1_ = cmd[0x7fb];
  return iVar3;
}

Assistant:

static int32_t pkg_archiveLibrary(const char *targetDir, const char *version, UBool reverseExt) {
    int32_t result = 0;
    char cmd[LARGE_BUFFER_MAX_SIZE];

    /* If the shared object suffix and the final object suffix is different and the final object suffix and the
     * archive file suffix is the same, then the final library needs to be archived.
     */
    if (uprv_strcmp(pkgDataFlags[SOBJ_EXT], pkgDataFlags[SO_EXT]) != 0 && uprv_strcmp(pkgDataFlags[A_EXT], pkgDataFlags[SO_EXT]) == 0) {
        sprintf(libFileNames[LIB_FILE_VERSION], "%s%s%s.%s",
                libFileNames[LIB_FILE],
                pkgDataFlags[LIB_EXT_ORDER][0] == '.' ? "." : "",
                reverseExt ? version : pkgDataFlags[SO_EXT],
                reverseExt ? pkgDataFlags[SO_EXT] : version);

        sprintf(cmd, "%s %s %s%s %s%s",
                pkgDataFlags[AR],
                pkgDataFlags[ARFLAGS],
                targetDir,
                libFileNames[LIB_FILE_VERSION],
                targetDir,
                libFileNames[LIB_FILE_VERSION_TMP]);

        result = runCommand(cmd); 
        if (result != 0) { 
            fprintf(stderr, "Error creating archive library. Failed command: %s\n", cmd);
            return result; 
        } 
        
        sprintf(cmd, "%s %s%s", 
            pkgDataFlags[RANLIB], 
            targetDir, 
            libFileNames[LIB_FILE_VERSION]);
        
        result = runCommand(cmd); 
        if (result != 0) {
            fprintf(stderr, "Error creating archive library. Failed command: %s\n", cmd);
            return result;
        }

        /* Remove unneeded library file. */
        sprintf(cmd, "%s %s%s",
                RM_CMD,
                targetDir,
                libFileNames[LIB_FILE_VERSION_TMP]);

        result = runCommand(cmd);
        if (result != 0) {
            fprintf(stderr, "Error creating archive library. Failed command: %s\n", cmd);
            return result;
        }

    } else {
        uprv_strcpy(libFileNames[LIB_FILE_VERSION], libFileNames[LIB_FILE_VERSION_TMP]);
    }

    return result;
}